

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_102::Scanner::Scanner(Scanner *this,OptInfo *optInfo)

{
  OptInfo *optInfo_local;
  Scanner *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Scanner_02718f28;
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::unordered_map(&this->readGlobals);
  this->optInfo = optInfo;
  return;
}

Assistant:

Scanner(OptInfo& optInfo) : optInfo(optInfo) {}